

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_makeClosureWithCaptures
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionDefinitionOperand,
               size_t captureCount,int16_t *elementOperands)

{
  int32_t iVar1;
  sysbvm_x86_register_t reg;
  size_t sVar2;
  int offset;
  uint8_t local_3b [4];
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  int local_34;
  
  if (-1 < resultOperand) {
    iVar1 = jit->contextPointerOffset;
    local_3b[0] = 'H';
    local_3b[1] = 0x8b;
    local_3b[2] = 0xbd;
    local_3b[3] = (uint8_t)iVar1;
    local_37 = (undefined1)((uint)iVar1 >> 8);
    local_36 = (undefined1)((uint)iVar1 >> 0x10);
    local_35 = (undefined1)((uint)iVar1 >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,7,local_3b);
    local_34 = (int)functionDefinitionOperand;
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionDefinitionOperand);
    sysbvm_jit_x86_call(jit,sysbvm_sequenceTuple_createForFunctionDefinition);
    local_3b[0] = 'H';
    local_3b[1] = 0x8b;
    local_3b[2] = 0xd0;
    sysbvm_bytecodeJit_addBytes(jit,3,local_3b);
    if (captureCount != 0) {
      offset = 0x10;
      sVar2 = 0;
      do {
        sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,elementOperands[sVar2]);
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit,SYSBVM_X86_64_ARG2,offset,SYSBVM_X86_64_ARG1);
        sVar2 = sVar2 + 1;
        offset = offset + 8;
      } while (captureCount != sVar2);
    }
    iVar1 = jit->contextPointerOffset;
    local_3b[0] = 'H';
    local_3b[1] = 0x8b;
    local_3b[2] = 0xbd;
    local_3b[3] = (uint8_t)iVar1;
    local_37 = (undefined1)((uint)iVar1 >> 8);
    local_36 = (undefined1)((uint)iVar1 >> 0x10);
    local_35 = (undefined1)((uint)iVar1 >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,7,local_3b);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,(int16_t)local_34);
    sysbvm_jit_x86_call(jit,sysbvm_function_createClosureWithCaptureVector);
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeClosureWithCaptures(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionDefinitionOperand, size_t captureCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    // Make the capture vector.
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionDefinitionOperand);
    sysbvm_jit_x86_call(jit, &sysbvm_sequenceTuple_createForFunctionDefinition);

    sysbvm_jit_x86_mov64Register(jit, SYSBVM_X86_64_ARG2, SYSBVM_X86_RAX);
    for(size_t i = 0; i < captureCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, elementOperands[i]);
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_64_ARG2, (int32_t) (sizeof(sysbvm_tuple_header_t) + i * sizeof(void*)), SYSBVM_X86_64_ARG1);
    }

    // Now construct the actual closure
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionDefinitionOperand);
    sysbvm_jit_x86_call(jit, &sysbvm_function_createClosureWithCaptureVector);
    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}